

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O3

void __thiscall
duckdb::SQLLogicTestRunner::LoadDatabase
          (SQLLogicTestRunner *this,string *dbpath,bool load_extensions)

{
  unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true> *this_00;
  _Head_base<0UL,_duckdb::DBConfig_*,_false> _Var1;
  DuckDB *this_01;
  type pDVar2;
  _Hash_node_base *p_Var3;
  ErrorData err;
  AssertionHandler catchAssertionHandler;
  undefined1 *local_108 [2];
  undefined1 local_f8 [200];
  
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->loaded_databases,(value_type *)dbpath);
  this_00 = &this->db;
  std::__uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>::reset
            ((__uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_> *)this_00,
             (pointer)0x0);
  std::__uniq_ptr_impl<duckdb::Connection,_std::default_delete<duckdb::Connection>_>::reset
            ((__uniq_ptr_impl<duckdb::Connection,_std::default_delete<duckdb::Connection>_> *)
             &this->con,(pointer)0x0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->named_connection_map)._M_h);
  _Var1._M_head_impl =
       (this->config).super_unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_>.
       _M_t.super___uniq_ptr_impl<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::DBConfig_*,_std::default_delete<duckdb::DBConfig>_>.
       super__Head_base<0UL,_duckdb::DBConfig_*,_false>._M_head_impl;
  this_01 = (DuckDB *)operator_new(0x10);
  duckdb::DuckDB::DuckDB(this_01,(string *)dbpath,_Var1._M_head_impl);
  std::__uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>::reset
            ((__uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_> *)this_00,
             this_01);
  pDVar2 = unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::operator*(this_00)
  ;
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"core_functions","");
  duckdb::ExtensionHelper::LoadExtension(pDVar2,(string *)local_108);
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0]);
  }
  Reconnect(this);
  p_Var3 = (this->extensions)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0 && load_extensions) {
    do {
      pDVar2 = unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::operator*
                         (this_00);
      duckdb::ExtensionHelper::LoadExtension(pDVar2,(string *)(p_Var3 + 1));
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void SQLLogicTestRunner::LoadDatabase(string dbpath, bool load_extensions) {
	loaded_databases.push_back(dbpath);

	// restart the database with the specified db path
	db.reset();
	con.reset();
	named_connection_map.clear();
	// now re-open the current database

	try {
		db = make_uniq<DuckDB>(dbpath, config.get());
		// always load core functions
		ExtensionHelper::LoadExtension(*db, "core_functions");
	} catch (std::exception &ex) {
		ErrorData err(ex);
		SQLLogicTestLogger::LoadDatabaseFail(dbpath, err.Message());
		FAIL();
	}
	Reconnect();

	// load any previously loaded extensions again
	if (load_extensions) {
		for (auto &extension : extensions) {
			ExtensionHelper::LoadExtension(*db, extension);
		}
	}
}